

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O2

float PhPacker::__phpack__detail::php_pack_parse_float(int is_little_endian,char *src)

{
  uint uVar1;
  float fVar2;
  
  if (is_little_endian == 0) {
    uVar1 = *(uint *)src;
    fVar2 = (float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
  }
  else {
    fVar2 = *(float *)src;
  }
  return fVar2;
}

Assistant:

float php_pack_parse_float(int is_little_endian, const char* src) noexcept
{
    char out[4] = {};
    if (!is_little_endian) {
        out[0] = src[3];
        out[1] = src[2];
        out[2] = src[1];
        out[3] = src[0];
    } else {
        out[0] = src[0];
        out[1] = src[1];
        out[2] = src[2];
        out[3] = src[3];
    }
    float f {};
    memcpy(&f, out, sizeof(float));
    return f;
}